

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

void __thiscall
t_c_glib_generator::generate_consts
          (t_c_glib_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  ofstream_with_content_based_conditional_update *poVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  pointer pcVar3;
  t_type *ttype;
  t_const_value *value;
  bool bVar4;
  ostream *poVar5;
  pointer pptVar6;
  t_c_glib_generator *this_00;
  string name_lc;
  string name;
  string name_uc;
  string local_160;
  string local_140;
  string local_120;
  undefined1 *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  ofstream_with_content_based_conditional_update *local_e0;
  vector<t_const_*,_std::allocator<t_const_*>_> *local_d8;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  poVar1 = &this->f_types_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* constants */",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  poVar2 = &this->f_types_impl_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/* constants */",0xf);
  local_e0 = poVar2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  pptVar6 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d8 = consts;
  if (pptVar6 !=
      (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_100 = local_f0;
      pcVar3 = ((*pptVar6)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar3,pcVar3 + ((*pptVar6)->name_)._M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_100,local_100 + local_f8);
      to_upper_case(&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_90,local_100,local_100 + local_f8);
      to_lower_case(&local_120,(string *)local_90);
      this_00 = (t_c_glib_generator *)local_90._0_8_;
      if ((t_c_glib_generator *)local_90._0_8_ != (t_c_glib_generator *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
      ttype = (*pptVar6)->type_;
      value = (*pptVar6)->value_;
      bVar4 = is_complex_type(this_00,ttype);
      if (bVar4) {
        type_name_abi_cxx11_(&local_140,this,ttype,false,false);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,local_140._M_dataplus._M_p,local_140._M_string_length)
        ;
        t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_160._M_dataplus._M_p,local_160._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(this->nspace_lc)._M_dataplus._M_p,
                            (this->nspace_lc)._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_120._M_dataplus._M_p,local_120._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_constant();",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#define ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(this->nspace_uc)._M_dataplus._M_p,
                          (this->nspace_uc)._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_120._M_dataplus._M_p,
                 local_120._M_dataplus._M_p + local_120._M_string_length);
      constant_value(&local_160,this,&local_b0,ttype,value);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_160._M_dataplus._M_p,local_160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_120._M_dataplus._M_p,
                 local_120._M_dataplus._M_p + local_120._M_string_length);
      generate_const_initializer(this,&local_d0,ttype,value,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (local_d8->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_e0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_c_glib_generator::generate_consts(vector<t_const*> consts) {
  f_types_ << "/* constants */" << endl;
  f_types_impl_ << "/* constants */" << endl;

  vector<t_const*>::iterator c_iter;
  for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
    string name = (*c_iter)->get_name();
    string name_uc = to_upper_case(name);
    string name_lc = to_lower_case(name);
    t_type* type = (*c_iter)->get_type();
    t_const_value* value = (*c_iter)->get_value();

    if (is_complex_type(type)) {
      f_types_ << type_name(type) << indent() << this->nspace_lc << name_lc
               << "_constant();" << endl;
    }

    f_types_ << indent() << "#define " << this->nspace_uc << name_uc << " "
             << constant_value(name_lc, type, value) << endl;

    generate_const_initializer(name_lc, type, value, true);
  }

  f_types_ << endl;
  f_types_impl_ << endl;
}